

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O2

long __thiscall gl4cts::AdvancedUsageMultiStage::Setup(AdvancedUsageMultiStage *this)

{
  this->vbo_ = 0;
  this->prog_ = 0;
  this->fbo_ = 0;
  this->rt_[0] = 0;
  this->counter_buffer_ = 0;
  this->xfb_buffer_[0] = 0;
  *(undefined8 *)(this->xfb_buffer_ + 1) = 0;
  this->rt_[1] = 0;
  return 0;
}

Assistant:

virtual long Setup()
	{
		counter_buffer_ = 0;
		xfb_buffer_[0] = xfb_buffer_[1] = 0;
		vao_ = vbo_ = 0;
		prog_		= 0;
		fbo_ = rt_[0] = rt_[1] = 0;
		return NO_ERROR;
	}